

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString *
icu_63::operator+(UnicodeString *__return_storage_ptr__,UnicodeString *s1,UnicodeString *s2)

{
  int32_t iVar1;
  int32_t iVar2;
  UnicodeString *pUVar3;
  UnicodeString local_60;
  UnicodeString *local_20;
  UnicodeString *s2_local;
  UnicodeString *s1_local;
  
  local_20 = s2;
  s2_local = s1;
  s1_local = __return_storage_ptr__;
  iVar1 = UnicodeString::length(s1);
  iVar2 = UnicodeString::length(local_20);
  UnicodeString::UnicodeString(&local_60,iVar1 + 1 + iVar2,0,0);
  pUVar3 = UnicodeString::append(&local_60,s2_local);
  pUVar3 = UnicodeString::append(pUVar3,local_20);
  UnicodeString::UnicodeString(__return_storage_ptr__,pUVar3);
  UnicodeString::~UnicodeString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

U_EXPORT2
operator+ (const UnicodeString &s1, const UnicodeString &s2) {
    return
        UnicodeString(s1.length()+s2.length()+1, (UChar32)0, 0).
            append(s1).
                append(s2);
}